

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::Mat(Mat *this,Mat *A,Mat *B)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar5 = (long)B->n_rows_ + (long)A->n_rows_;
  iVar4 = (int)lVar5;
  this->n_rows_ = iVar4;
  this->n_cols_ = A->n_cols_;
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar6 = lVar5 * 8;
  }
  pdVar3 = (double *)operator_new__(uVar6);
  this->v_ = pdVar3;
  iVar4 = A->n_rows_;
  pdVar2 = A->v_;
  for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    pdVar3[lVar5] = pdVar2[lVar5];
  }
  uVar1 = B->n_rows_;
  pdVar2 = B->v_;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pdVar3[(long)(int)uVar1 + uVar6] = pdVar2[uVar6];
  }
  return;
}

Assistant:

Mat::Mat(const Mat &A, const Mat &B)
{
	n_rows_ = A.n_rows_ + B.n_rows_;
	n_cols_ = A.n_cols_;
	v_ = new double [n_rows_];
	int i;
	for (i=0; i<A.n_rows_; i++)
		v_[i]=A.v_[i];
	for (i=0; i<B.n_rows_; i++)
		(*this)(i+B.n_rows_)=B.v_[i];
}